

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O3

SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker,SW_FT_Int side)

{
  SW_FT_Byte *pSVar1;
  SW_FT_Vector *pSVar2;
  SW_FT_Byte *pSVar3;
  SW_FT_StrokeBorder pSVar4;
  SW_FT_Angle SVar5;
  long lVar6;
  SW_FT_Fixed SVar7;
  SW_FT_Long SVar8;
  SW_FT_Long SVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  SW_FT_Vector local_98;
  long local_88;
  SW_FT_StrokeBorder local_80;
  SW_FT_Fixed local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  SW_FT_Stroker local_50;
  SW_FT_Vector local_48;
  
  local_78 = stroker->radius;
  uVar10 = (ulong)(uint)side;
  SVar5 = SW_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  lVar14 = uVar10 * 0x1680000 + -0xb40000;
  if (SVar5 != 0xb40000) {
    lVar14 = SVar5;
  }
  local_80 = stroker->borders + uVar10;
  lVar6 = -lVar14;
  if (0 < lVar14) {
    lVar6 = lVar14;
  }
  if (lVar6 < 0x5a0001) {
    lVar6 = 0x5a0000;
  }
  lVar11 = uVar10 * -0xb40000 + stroker->angle_in + 0x5a0000;
  uVar10 = (lVar6 - 1U) / 0x5a0000 + 1;
  SVar7 = SW_FT_Tan(lVar14 / (long)(ulong)(uint)((int)uVar10 * 4));
  lVar6 = SVar7 / 3 + SVar7;
  local_60 = lVar11;
  SW_FT_Vector_From_Polar(&local_48,local_78,lVar11);
  local_88 = SW_FT_MulFix(-local_48.y,lVar6);
  local_70 = lVar6;
  SVar8 = SW_FT_MulFix(local_48.x,lVar6);
  local_48.x = (stroker->center).x + local_48.x;
  local_48.y = (stroker->center).y + local_48.y;
  lVar6 = local_48.x + local_88;
  lVar11 = local_48.y + SVar8;
  local_88 = (uVar10 & 0xffffffff) + (ulong)((uVar10 & 0xffffffff) == 0);
  local_68 = uVar10;
  local_58 = lVar14;
  local_50 = stroker;
  do {
    SW_FT_Vector_From_Polar(&local_98,local_78,lVar14 / (long)local_68 + local_60);
    lVar12 = local_70;
    SVar8 = SW_FT_MulFix(local_98.y,local_70);
    SVar9 = SW_FT_MulFix(-local_98.x,lVar12);
    pSVar4 = local_80;
    local_98.x = (local_50->center).x + local_98.x;
    local_98.y = (local_50->center).y + local_98.y;
    lVar13 = local_98.x + SVar8;
    lVar12 = local_98.y + SVar9;
    ft_stroke_border_grow(local_80,3);
    pSVar2 = pSVar4->points;
    uVar10 = (ulong)pSVar4->num_points;
    pSVar3 = pSVar4->tags;
    pSVar2[uVar10].x = lVar6;
    pSVar2[uVar10].y = lVar11;
    pSVar2[uVar10 + 1].x = lVar13;
    pSVar2[uVar10 + 1].y = lVar12;
    pSVar2[uVar10 + 2].x = local_98.x;
    pSVar2[uVar10 + 2].y = local_98.y;
    pSVar1 = pSVar3 + uVar10;
    pSVar1[0] = '\x02';
    pSVar1[1] = '\x02';
    pSVar3[uVar10 + 2] = '\x01';
    pSVar4->num_points = pSVar4->num_points + 3;
    pSVar4->movable = '\0';
    lVar6 = local_98.x * 2 - lVar13;
    lVar11 = local_98.y * 2 - lVar12;
    lVar14 = lVar14 + local_58;
    local_88 = local_88 + -1;
  } while (local_88 != 0);
  local_80->movable = '\0';
  return (SW_FT_Error)local_80;
}

Assistant:

static SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker, SW_FT_Int side)
{
    SW_FT_Angle        total, rotate;
    SW_FT_Fixed        radius = stroker->radius;
    SW_FT_Error        error = 0;
    SW_FT_StrokeBorder border = stroker->borders + side;

    rotate = SW_FT_SIDE_TO_ROTATE(side);

    total = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == SW_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}